

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O0

bool __thiscall Filter::excludeContent(Filter *this,string *line)

{
  reference this_00;
  pointer this_01;
  bool local_39;
  _Self local_30;
  _Self local_28;
  const_iterator it;
  bool exclude;
  string *line_local;
  Filter *this_local;
  
  it._M_node._7_1_ = 0;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<Regex,_std::default_delete<Regex>_>,_std::allocator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>_>
       ::begin(&this->m_exContent);
  while( true ) {
    local_39 = false;
    if ((it._M_node._7_1_ & 1) == 0) {
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::unique_ptr<Regex,_std::default_delete<Regex>_>,_std::allocator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>_>
           ::end(&this->m_exContent);
      local_39 = std::operator!=(&local_28,&local_30);
    }
    if (local_39 == false) break;
    this_00 = std::_List_const_iterator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>::
              operator*(&local_28);
    this_01 = std::unique_ptr<Regex,_std::default_delete<Regex>_>::operator->(this_00);
    it._M_node._7_1_ = Regex::match(this_01,line,(Match *)0x0);
    std::_List_const_iterator<std::unique_ptr<Regex,_std::default_delete<Regex>_>_>::operator++
              (&local_28);
  }
  return (bool)(it._M_node._7_1_ & 1);
}

Assistant:

bool Filter::excludeContent(std::string const & line) const
{
    bool exclude = false;

    // Exclude filters
    Regex::PtrList::const_iterator it = m_exContent.begin();
    for (; !exclude && it != m_exContent.end(); ++it) {
        exclude = (*it)->match(line);
    }
    return exclude;
}